

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkCovDeriveClean(Cov_Man_t *p,Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pFanin;
  int iVar2;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    for (iVar2 = 0; iVar2 < pNtk->vCos->nSize; iVar2 = iVar2 + 1) {
      pAVar1 = Abc_NtkCo(pNtk,iVar2);
      pFanin = Abc_NtkCovDeriveNodeInv_rec
                         (p,pNtk_00,
                          (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray],
                          *(uint *)&pAVar1->field_0x14 >> 10 & 1);
      Abc_ObjAddFanin((pAVar1->field_6).pCopy,pFanin);
    }
    Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
    iVar2 = Abc_NtkCheck(pNtk_00);
    if (iVar2 == 0) {
      puts("Abc_NtkCovDeriveInv: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
    return pNtk_00;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covBuild.c"
                ,0x16a,"Abc_Ntk_t *Abc_NtkCovDeriveClean(Cov_Man_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkCovDeriveClean( Cov_Man_t * p, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pNodeNew;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // reconstruct the network
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pNodeNew = Abc_NtkCovDeriveNodeInv_rec( p, pNtkNew, Abc_ObjFanin0(pObj), Abc_ObjFaninC0(pObj) );
        Abc_ObjAddFanin( pObj->pCopy, pNodeNew );
    }
    // add the COs
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCovDeriveInv: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}